

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationalBayesEstimatorOnLDA.cpp
# Opt level: O0

void __thiscall
VariationalBayesEstimatorOnLDA::initializeHyperParam(VariationalBayesEstimatorOnLDA *this)

{
  value_type_conflict local_20;
  value_type_conflict local_18;
  VariationalBayesEstimatorOnLDA *local_10;
  VariationalBayesEstimatorOnLDA *this_local;
  
  local_18 = 0.1;
  local_10 = this;
  std::vector<double,_std::allocator<double>_>::assign(&this->_alpha,(ulong)this->_K,&local_18);
  local_20 = 0.05;
  std::vector<double,_std::allocator<double>_>::assign(&this->_beta,(ulong)this->_V,&local_20);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&this->_alphaTimeSeries,&this->_alpha);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&this->_betaTimeSeries,&this->_beta);
  (*this->_vptr_VariationalBayesEstimatorOnLDA[5])();
  return;
}

Assistant:

void VariationalBayesEstimatorOnLDA::initializeHyperParam(){//{{{
    _alpha.assign(_K, 0.1);
    _beta.assign(_V, 0.05);
    _alphaTimeSeries.push_back(_alpha);
    _betaTimeSeries.push_back(_beta);
    this->calculateHyperParamSum();
}